

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

void __thiscall
cmTestGenerator::cmTestGenerator
          (cmTestGenerator *this,cmTest *test,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations)

{
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"CTEST_CONFIGURATION_TYPE",&local_41);
  cmScriptGenerator::cmScriptGenerator(&this->super_cmScriptGenerator,&local_40,configurations);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_cmScriptGenerator)._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmTestGenerator_00686748;
  this->Test = test;
  (this->super_cmScriptGenerator).ActionsPerConfig = (bool)(test->OldStyle ^ 1);
  this->TestGenerated = false;
  this->LG = (cmLocalGenerator *)0x0;
  return;
}

Assistant:

cmTestGenerator
::cmTestGenerator(cmTest* test,
                  std::vector<std::string> const& configurations):
  cmScriptGenerator("CTEST_CONFIGURATION_TYPE", configurations),
  Test(test)
{
  this->ActionsPerConfig = !test->GetOldStyle();
  this->TestGenerated = false;
  this->LG = 0;
}